

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyPoint2Point.cpp
# Opt level: O0

void __thiscall btMultiBodyPoint2Point::debugDraw(btMultiBodyPoint2Point *this,btIDebugDraw *drawer)

{
  long *in_RSI;
  btVector3 *in_RDI;
  btVector3 pivotBworld;
  btVector3 pivot_1;
  btVector3 pivotAworld;
  btVector3 pivot;
  btTransform tr;
  btTransform *in_stack_ffffffffffffff70;
  btTransform *in_stack_ffffffffffffff80;
  btVector3 local_70;
  btVector3 local_60;
  undefined1 local_50 [8];
  btVector3 *in_stack_ffffffffffffffb8;
  btScalar in_stack_ffffffffffffffc4;
  btMultiBody *in_stack_ffffffffffffffc8;
  
  btTransform::btTransform(in_stack_ffffffffffffff70);
  btTransform::setIdentity(in_stack_ffffffffffffff80);
  if (*(long *)in_RDI[6].m_floats != 0) {
    btRigidBody::getCenterOfMassTransform(*(btRigidBody **)in_RDI[6].m_floats);
    local_60 = btTransform::operator*(in_stack_ffffffffffffff70,in_RDI);
    btTransform::setOrigin((btTransform *)local_50,&local_60);
    (**(code **)(*in_RSI + 0x80))(0x3dcccccd,in_RSI,local_50);
  }
  if (*(long *)(in_RDI->m_floats + 2) != 0) {
    local_70 = btMultiBody::localPosToWorld
                         (in_stack_ffffffffffffffc8,(int)in_stack_ffffffffffffffc4,
                          in_stack_ffffffffffffffb8);
    btTransform::setOrigin((btTransform *)local_50,&local_70);
    (**(code **)(*in_RSI + 0x80))(0x3dcccccd,in_RSI,local_50);
  }
  if (*(long *)(in_RDI[6].m_floats + 2) != 0) {
    btRigidBody::getCenterOfMassTransform(*(btRigidBody **)(in_RDI[6].m_floats + 2));
    btTransform::operator*(in_stack_ffffffffffffff70,in_RDI);
    btTransform::setOrigin((btTransform *)local_50,(btVector3 *)&stack0xffffffffffffff80);
    (**(code **)(*in_RSI + 0x80))(0x3dcccccd,in_RSI,local_50);
  }
  if (*(long *)in_RDI[1].m_floats != 0) {
    btMultiBody::localPosToWorld
              (in_stack_ffffffffffffffc8,(int)in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
    btTransform::setOrigin((btTransform *)local_50,(btVector3 *)&stack0xffffffffffffff70);
    (**(code **)(*in_RSI + 0x80))(0x3dcccccd,in_RSI,local_50);
  }
  return;
}

Assistant:

void btMultiBodyPoint2Point::debugDraw(class btIDebugDraw* drawer)
{
	btTransform tr;
	tr.setIdentity();

	if (m_rigidBodyA)
	{
		btVector3 pivot = m_rigidBodyA->getCenterOfMassTransform() * m_pivotInA;
		tr.setOrigin(pivot);
		drawer->drawTransform(tr, 0.1);
	}
	if (m_bodyA)
	{
		btVector3 pivotAworld = m_bodyA->localPosToWorld(m_linkA, m_pivotInA);
		tr.setOrigin(pivotAworld);
		drawer->drawTransform(tr, 0.1);
	}
	if (m_rigidBodyB)
	{
		// that ideally should draw the same frame
		btVector3 pivot = m_rigidBodyB->getCenterOfMassTransform() * m_pivotInB;
		tr.setOrigin(pivot);
		drawer->drawTransform(tr, 0.1);
	}
	if (m_bodyB)
	{
		btVector3 pivotBworld = m_bodyB->localPosToWorld(m_linkB, m_pivotInB);
		tr.setOrigin(pivotBworld);
		drawer->drawTransform(tr, 0.1);
	}
}